

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswDyn.c
# Opt level: O1

int Ssw_ManSweepResimulateDynLocal(Ssw_Man_t *p,int f)

{
  uint uVar1;
  Aig_Man_t *pAVar2;
  int iVar3;
  int iVar4;
  void **ppvVar5;
  Vec_Ptr_t *pVVar6;
  Aig_Obj_t **ppAVar7;
  long lVar8;
  Aig_Obj_t *pAVar9;
  uint uVar10;
  long lVar11;
  Aig_Obj_t *pAVar12;
  long lVar13;
  int nSize;
  timespec ts;
  int local_44;
  timespec local_40;
  
  iVar3 = clock_gettime(3,&local_40);
  if (iVar3 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  p->nSimRounds = p->nSimRounds + 1;
  Ssw_ManSweepTransferDyn(p);
  p->vResimConsts->nSize = 0;
  p->vResimClasses->nSize = 0;
  Aig_ManIncrementTravId(p->pAig);
  for (uVar10 = p->iNodeStart; (int)uVar10 < p->pPars->nResimDelta + p->iNodeLast;
      uVar10 = uVar10 + 1) {
    pAVar2 = p->pAig;
    pVVar6 = pAVar2->vObjs;
    if (pVVar6->nSize <= (int)uVar10) break;
    if (pVVar6 == (Vec_Ptr_t *)0x0) {
      pAVar12 = (Aig_Obj_t *)0x0;
    }
    else {
      if ((int)uVar10 < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pAVar12 = (Aig_Obj_t *)pVVar6->pArray[uVar10];
    }
    if (pAVar12 != (Aig_Obj_t *)0x0) {
      ppAVar7 = pAVar2->pReprs;
      if (ppAVar7 == (Aig_Obj_t **)0x0) {
        pAVar9 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar9 = ppAVar7[pAVar12->Id];
      }
      if (pAVar9 == pAVar2->pConst1) {
        pVVar6 = p->vResimConsts;
      }
      else {
        if (ppAVar7 == (Aig_Obj_t **)0x0) {
          pAVar12 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar12 = ppAVar7[pAVar12->Id];
        }
        if ((pAVar12 == (Aig_Obj_t *)0x0) || (pAVar12->TravId == pAVar2->nTravIds))
        goto LAB_005e355c;
        pAVar12->TravId = pAVar2->nTravIds;
        pVVar6 = p->vResimClasses;
      }
      uVar1 = pVVar6->nCap;
      if (pVVar6->nSize == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (pVVar6->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar6->pArray,0x80);
          }
          pVVar6->pArray = ppvVar5;
          iVar3 = 0x10;
        }
        else {
          iVar3 = uVar1 * 2;
          if (iVar3 <= (int)uVar1) goto LAB_005e3546;
          if (pVVar6->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar6->pArray,(ulong)uVar1 << 4);
          }
          pVVar6->pArray = ppvVar5;
        }
        pVVar6->nCap = iVar3;
      }
LAB_005e3546:
      iVar3 = pVVar6->nSize;
      pVVar6->nSize = iVar3 + 1;
      pVVar6->pArray[iVar3] = pAVar12;
    }
LAB_005e355c:
  }
  p->nVisCounter = p->nVisCounter + 1;
  pVVar6 = p->vResimConsts;
  if (0 < pVVar6->nSize) {
    lVar13 = 0;
    do {
      Ssw_SmlSimulateOneDyn_rec
                (p->pSml,(Aig_Obj_t *)pVVar6->pArray[lVar13],p->nFrames + -1,p->pVisited,
                 p->nVisCounter);
      lVar13 = lVar13 + 1;
      pVVar6 = p->vResimConsts;
    } while (lVar13 < pVVar6->nSize);
  }
  pVVar6 = p->vResimClasses;
  if (0 < pVVar6->nSize) {
    lVar13 = 0;
    do {
      ppAVar7 = Ssw_ClassesReadClass(p->ppClasses,(Aig_Obj_t *)pVVar6->pArray[lVar13],&local_44);
      if (0 < local_44) {
        lVar11 = 0;
        do {
          Ssw_SmlSimulateOneDyn_rec
                    (p->pSml,ppAVar7[lVar11],p->nFrames + -1,p->pVisited,p->nVisCounter);
          lVar11 = lVar11 + 1;
        } while (lVar11 < local_44);
      }
      lVar13 = lVar13 + 1;
      pVVar6 = p->vResimClasses;
    } while (lVar13 < pVVar6->nSize);
  }
  iVar3 = Ssw_ClassesRefineConst1Group(p->ppClasses,p->vResimConsts,1);
  pVVar6 = p->vResimClasses;
  uVar10 = 0;
  if (0 < pVVar6->nSize) {
    lVar13 = 0;
    do {
      iVar4 = Ssw_ClassesRefineOneClass(p->ppClasses,(Aig_Obj_t *)pVVar6->pArray[lVar13],1);
      uVar10 = uVar10 + iVar4;
      lVar13 = lVar13 + 1;
      pVVar6 = p->vResimClasses;
    } while (lVar13 < pVVar6->nSize);
    uVar10 = (uint)(0 < (int)uVar10);
  }
  pVVar6 = p->vSimInfo;
  if (0 < pVVar6->nSize) {
    lVar13 = 0;
    do {
      *(undefined4 *)pVVar6->pArray[lVar13] = 0;
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVVar6->nSize);
  }
  p->nPatterns = 0;
  p->nSimRounds = p->nSimRounds + 1;
  iVar4 = clock_gettime(3,&local_40);
  if (iVar4 < 0) {
    lVar13 = -1;
  }
  else {
    lVar13 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  p->timeSimSat = p->timeSimSat + lVar13 + lVar8;
  return (uint)(byte)(0 < iVar3 | (byte)uVar10);
}

Assistant:

int Ssw_ManSweepResimulateDynLocal( Ssw_Man_t * p, int f )
{
    Aig_Obj_t * pObj, * pRepr, ** ppClass;
    int i, k, nSize, RetValue1, RetValue2;
    abctime clk = Abc_Clock();
    p->nSimRounds++;
    // transfer PI simulation information from storage
//    Ssw_SmlAssignDist1Plus( p->pSml, p->pPatWords );
    Ssw_ManSweepTransferDyn( p );
    // determine const1 cands and classes to be simulated
    Vec_PtrClear( p->vResimConsts );
    Vec_PtrClear( p->vResimClasses );
    Aig_ManIncrementTravId( p->pAig );
    for ( i = p->iNodeStart; i < p->iNodeLast + p->pPars->nResimDelta; i++ )
    {
        if ( i >= Aig_ManObjNumMax( p->pAig ) )
            break;
        pObj = Aig_ManObj( p->pAig, i );
        if ( pObj == NULL )
            continue;
        if ( Ssw_ObjIsConst1Cand(p->pAig, pObj) )
        {
            Vec_PtrPush( p->vResimConsts, pObj );
            continue;
        }
        pRepr = Aig_ObjRepr(p->pAig, pObj);
        if ( pRepr == NULL )
            continue;
        if ( Aig_ObjIsTravIdCurrent(p->pAig, pRepr) )
            continue;
        Aig_ObjSetTravIdCurrent(p->pAig, pRepr);
        Vec_PtrPush( p->vResimClasses, pRepr );
    }
    // simulate internal nodes
//    Ssw_SmlSimulateOneFrame( p->pSml );
//    Ssw_SmlSimulateOne( p->pSml );
    // resimulate dynamically
//    Aig_ManIncrementTravId( p->pAig );
//    Aig_ObjIsTravIdCurrent( p->pAig, Aig_ManConst1(p->pAig) );
    p->nVisCounter++;
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vResimConsts, pObj, i )
        Ssw_SmlSimulateOneDyn_rec( p->pSml, pObj, p->nFrames-1, p->pVisited, p->nVisCounter );
    // resimulate the cone of influence of the cand classes
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vResimClasses, pRepr, i )
    {
        ppClass = Ssw_ClassesReadClass( p->ppClasses, pRepr, &nSize );
        for ( k = 0; k < nSize; k++ )
            Ssw_SmlSimulateOneDyn_rec( p->pSml, ppClass[k], p->nFrames-1, p->pVisited, p->nVisCounter );
    }

    // check equivalence classes
//    RetValue1 = Ssw_ClassesRefineConst1( p->ppClasses, 1 );
//    RetValue2 = Ssw_ClassesRefine( p->ppClasses, 1 );
    // refine these nodes
    RetValue1 = Ssw_ClassesRefineConst1Group( p->ppClasses, p->vResimConsts, 1 );
    RetValue2 = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vResimClasses, pRepr, i )
        RetValue2 += Ssw_ClassesRefineOneClass( p->ppClasses, pRepr, 1 );

    // prepare simulation info for the next round
    Vec_PtrCleanSimInfo( p->vSimInfo, 0, 1 );
    p->nPatterns = 0;
    p->nSimRounds++;
p->timeSimSat += Abc_Clock() - clk;
    return RetValue1 > 0 || RetValue2 > 0;
}